

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

char __thiscall anon_unknown.dwarf_b4927a::NumericTokenizer::nextToken(NumericTokenizer *this)

{
  QStringView *lhs;
  storage_type_conflict sVar1;
  storage_type_conflict sVar2;
  char32_t cVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  qsizetype qVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long in_FS_OFFSET;
  QStringView s;
  QStringView s_00;
  QStringView s_01;
  QStringView local_50;
  QStringView local_40;
  QStringView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = this->m_index;
  local_30.m_data = (this->m_text).m_data + lVar4;
  local_30.m_size = (this->m_text).m_size - lVar4;
  sVar1 = *local_30.m_data;
  if ((ushort)sVar1 == 0x2212) {
    this->m_index = lVar4 + 1;
LAB_002e044a:
    bVar8 = 0x2d;
    goto LAB_002e044d;
  }
  uVar11 = (uint)(ushort)sVar1;
  uVar9 = (uint)(ushort)sVar1;
  if ((this->m_guide).isC == true) {
    this->m_index = lVar4 + 1;
    if ((ushort)sVar1 < 0x100) {
      uVar11 = uVar11 | 0x20;
      if ((ushort)sVar1 < 0x41) {
        uVar11 = uVar9;
      }
      bVar8 = (byte)uVar11;
      if (((uVar11 - 0x30 < 10) || ((0x2a < uVar11 && ((int)uVar11 <= (int)this->lastMark)))) ||
         ((this->m_mode != IntegerMode &&
          (((uVar11 - 0x61 < 0x20 && ((1 << ((byte)(uVar11 - 0x61) & 0x1f) & 0x2121U) != 0)) ||
           (bVar8 = 0x65, uVar11 == 0x65 && this->m_mode == DoubleScientificMode))))))
      goto LAB_002e044d;
    }
    goto LAB_002e084e;
  }
  if ((ushort)sVar1 < 0x100) {
    uVar5 = (ushort)sVar1 | 0x20;
    if ((ushort)sVar1 < 0x41) {
      uVar5 = uVar9;
    }
    bVar8 = (byte)uVar5;
    if (((((int)(char)bVar8 - 0x30U < 10) || (bVar8 == 0x2b)) || ((uVar5 & 0xff) == 0x2d)) ||
       (((this->m_mode != IntegerMode && (uVar5 - 0x61 < 0x20)) &&
        ((1 << ((byte)(uVar5 - 0x61) & 0x1f) & 0x2121U) != 0)))) {
      this->m_index = lVar4 + 1;
      goto LAB_002e044d;
    }
  }
  bVar6 = QStringView::startsWith(&local_30,(this->m_guide).minus,CaseSensitive);
  if (bVar6) {
    this->m_index = this->m_index + (this->m_guide).minus.m_size;
    goto LAB_002e044a;
  }
  bVar6 = QStringView::startsWith(&local_30,(this->m_guide).plus,CaseSensitive);
  if (bVar6) {
    this->m_index = this->m_index + (this->m_guide).plus.m_size;
    bVar8 = 0x2b;
    goto LAB_002e044d;
  }
  lVar4 = (this->m_guide).group.m_size;
  if ((lVar4 != 0) &&
     (s.m_data = (this->m_guide).group.m_data, s.m_size = lVar4,
     bVar6 = QStringView::startsWith(&local_30,s,CaseSensitive), bVar6)) {
    this->m_index = this->m_index + (this->m_guide).group.m_size;
    bVar6 = fractionGroupClash(this);
    if ((bVar6) &&
       (qVar7 = QStringView::indexOf
                          (&local_30,(this->m_guide).decimal,(this->m_guide).group.m_size,
                           CaseSensitive), qVar7 == -1)) {
LAB_002e0655:
      bVar8 = 0x2e;
      goto LAB_002e044d;
    }
LAB_002e07f3:
    bVar8 = 0x2c;
    goto LAB_002e044d;
  }
  if (this->m_mode == IntegerMode) {
LAB_002e0697:
    if ((this->m_guide).zeroLen == '\x01') {
      if ((sVar1 & 0xf800U) == 0xd800) {
        if ((((sVar1 & 0xdc00U) != 0xd800) || (local_30.m_size < 2)) ||
           ((local_30.m_data[1] & 0xfc00U) != 0xdc00)) goto LAB_002e078c;
      }
      else {
        cVar3 = (this->m_guide).zeroUcs;
        if (cVar3 == L'〇') {
          if (uVar9 == 0x3020) goto LAB_002e078c;
          if (uVar9 == 0x3007) goto LAB_002e077f;
          uVar11 = uVar11 - 0x3020;
        }
        else {
LAB_002e077f:
          uVar11 = uVar11 - cVar3;
        }
        if (uVar11 < 10) {
          this->m_index = this->m_index + 1;
          bVar8 = (byte)uVar11 | 0x30;
          goto LAB_002e044d;
        }
LAB_002e078c:
        lhs = &(this->m_guide).group;
        local_40.m_size = 1;
        local_40.m_data = L"\xa0";
        bVar6 = ::comparesEqual(lhs,&local_40);
        if (bVar6) {
LAB_002e07d9:
          if ((local_30.m_size != 0) && (*local_30.m_data == L' ')) {
            this->m_index = this->m_index + 1;
            goto LAB_002e07f3;
          }
        }
        else {
          local_50.m_size = 1;
          local_50.m_data = L"\x202f";
          bVar6 = ::comparesEqual(lhs,&local_50);
          if (bVar6) goto LAB_002e07d9;
        }
        if ((this->m_guide).exponentCyrillic == true) {
          s_00.m_data = L"Е";
          s_00.m_size = 1;
          bVar6 = QStringView::startsWith(&local_30,s_00,CaseInsensitive);
          if (!bVar6) {
            s_01.m_data = L"E";
            s_01.m_size = 1;
            bVar6 = QStringView::startsWith(&local_30,s_01,CaseInsensitive);
            bVar8 = 0;
            if (!bVar6) goto LAB_002e044d;
          }
          this->m_index = this->m_index + 1;
          goto LAB_002e0846;
        }
      }
    }
    else {
      if ((sVar1 & 0xfc00U) != 0xd800) goto LAB_002e078c;
      if (1 < local_30.m_size) {
        sVar2 = local_30.m_data[1];
        bVar8 = 0;
        if ((sVar2 & 0xfc00U) == 0xdc00) {
          this->m_index = this->m_index + 2;
          iVar10 = ((uint)(ushort)sVar1 * 0x400 + (uint)(ushort)sVar2) - (this->m_guide).zeroUcs;
          bVar8 = 0;
          if (iVar10 + 0xfca02400U < 10) {
            bVar8 = (char)iVar10 + 0x30;
          }
        }
        goto LAB_002e044d;
      }
    }
LAB_002e084e:
    bVar8 = 0;
  }
  else {
    bVar6 = QStringView::startsWith(&local_30,(this->m_guide).decimal,CaseSensitive);
    if (bVar6) {
      this->m_index = this->m_index + (this->m_guide).decimal.m_size;
      goto LAB_002e0655;
    }
    if ((this->m_mode != DoubleScientificMode) ||
       (bVar6 = QStringView::startsWith(&local_30,(this->m_guide).exponent,CaseInsensitive), !bVar6)
       ) goto LAB_002e0697;
    this->m_index = this->m_index + (this->m_guide).exponent.m_size;
LAB_002e0846:
    bVar8 = 0x65;
  }
LAB_002e044d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

char NumericTokenizer::nextToken()
{
    // As long as caller stops iterating on a zero return, those don't need to
    // keep m_index correctly updated.
    Q_ASSERT(!done());
    // Mauls non-letters above 'Z' but we don't care:
    const auto asciiLower = [](unsigned char c) { return c >= 'A' ? c | 0x20 : c; };
    const QStringView tail = m_text.sliced(m_index);
    const QChar ch = tail.front();
    if (ch == u'\u2212') {
        // Special case: match the "proper" minus sign, for all locales.
        ++m_index;
        return '-';
    }
    if (m_guide.isC) {
        // "Conversion" to C locale is just a filter:
        ++m_index;
        if (Q_LIKELY(ch.unicode() < 256)) {
            unsigned char ascii = asciiLower(ch.toLatin1());
            if (Q_LIKELY(isAsciiDigit(ascii) || ('+' <= ascii && ascii <= lastMark)
                         // No caller presently (6.5) passes DoubleStandardMode,
                         // so !IntegerMode implies scientific, for now.
                         || (m_mode != QLocaleData::IntegerMode && isInfNanChar(ascii))
                         || (m_mode == QLocaleData::DoubleScientificMode && ascii == 'e'))) {
                return ascii;
            }
        }
        return 0;
    }
    if (ch.unicode() < 256) {
        // Accept the C locale's digits and signs in all locales:
        char ascii = asciiLower(ch.toLatin1());
        if (isAsciiDigit(ascii) || ascii == '-' || ascii == '+'
            // Also its Inf and NaN letters:
            || (m_mode != QLocaleData::IntegerMode && isInfNanChar(ascii))) {
            ++m_index;
            return ascii;
        }
    }

    // Other locales may be trickier:
    if (tail.startsWith(m_guide.minus)) {
        m_index += m_guide.minus.size();
        return '-';
    }
    if (tail.startsWith(m_guide.plus)) {
        m_index += m_guide.plus.size();
        return '+';
    }
    if (!m_guide.group.isEmpty() && tail.startsWith(m_guide.group)) {
        m_index += m_guide.group.size();
        // When group and decimal coincide, and a fractional part is not
        // unexpected, treat the last as a fractional part separator (and leave
        // the caller to special-case the situations where that causes a
        // parse-fail that we can dodge by not reading it that way).
        if (fractionGroupClash() && tail.indexOf(m_guide.decimal, m_guide.group.size()) == -1)
            return '.';
        return ',';
    }
    if (m_mode != QLocaleData::IntegerMode && tail.startsWith(m_guide.decimal)) {
        m_index += m_guide.decimal.size();
        return '.';
    }
    if (m_mode == QLocaleData::DoubleScientificMode
        && tail.startsWith(m_guide.exponent, Qt::CaseInsensitive)) {
        m_index += m_guide.exponent.size();
        return 'e';
    }

    // Must match qlocale_tools.h's unicodeForDigit()
    if (m_guide.zeroLen == 1) {
        if (!ch.isSurrogate()) {
            const uint gap = asBmpDigit(ch.unicode());
            if (gap < 10u) {
                ++m_index;
                return '0' + gap;
            }
        } else if (ch.isHighSurrogate() && tail.size() > 1 && tail.at(1).isLowSurrogate()) {
            return 0;
        }
    } else if (ch.isHighSurrogate()) {
        // None of the corner cases below matches a surrogate, so (update
        // already and) return early if we don't have a digit.
        if (tail.size() > 1) {
            QChar low = tail.at(1);
            if (low.isLowSurrogate()) {
                m_index += 2;
                const uint gap = QChar::surrogateToUcs4(ch, low) - m_guide.zeroUcs;
                return gap < 10u ? '0' + gap : 0;
            }
        }
        return 0;
    }

    // All cases where tail starts with properly-matched surrogate pair
    // have been handled by this point.
    Q_ASSERT(!(ch.isHighSurrogate() && tail.size() > 1 && tail.at(1).isLowSurrogate()));

    // Weird corner cases follow (code above assumes these match no surrogates).

    // Some locales use a non-breaking space (U+00A0) or its thin version
    // (U+202f) for grouping. These look like spaces, so people (and thus some
    // of our tests) use a regular space instead and complain if it doesn't
    // work.
    // Should this be extended generally to any case where group is a space ?
    if ((m_guide.group == u"\u00a0" || m_guide.group == u"\u202f") && tail.startsWith(u' ')) {
        ++m_index;
        return ',';
    }

    // Cyrillic has its own E, used by Ukrainian as exponent; but others
    // writing Cyrillic may well use that; and Ukrainians might well use E.
    // All other Cyrillic locales (officially) use plain ASCII E.
    if (m_guide.exponentCyrillic // Only true in scientific float mode.
        && (tail.startsWith(u"\u0415", Qt::CaseInsensitive)
            || tail.startsWith(u"E", Qt::CaseInsensitive))) {
        ++m_index;
        return 'e';
    }

    return 0;
}